

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_optimizer.hpp
# Opt level: O2

unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
 __thiscall
chaiscript::optimizer::Constant_Fold::
optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
          (Constant_Fold *this,
          AST_Node_Impl_Ptr<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *node)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  bool bVar5;
  Opers OVar6;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  float val_00;
  double val_01;
  string_view t_str;
  string_view t_str_00;
  Boxed_Value val;
  Boxed_Value lhs;
  Boxed_Value rhs;
  Boxed_Value lhs_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> match;
  Boxed_Value val_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  lVar2 = *in_RDX;
  iVar1 = *(int *)(lVar2 + 8);
  if (iVar1 - 0x20U < 2) {
    plVar4 = *(long **)(lVar2 + 0x50);
    if (((*(long *)(lVar2 + 0x58) - (long)plVar4 != 0x10) ||
        (plVar3 = (long *)*plVar4, (int)plVar3[1] != 0x2b)) || (*(int *)(plVar4[1] + 8) != 0x2b))
    goto LAB_003c3cc8;
    if ((undefined **)*plVar3 != &PTR_get_children_00488068) {
      __cxa_bad_cast();
    }
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&lhs_1,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
               (plVar3 + 0xd));
    plVar4 = *(long **)(*(long *)(*in_RDX + 0x50) + 8);
    if ((undefined **)*plVar4 != &PTR_get_children_00488068) {
      __cxa_bad_cast();
    }
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&rhs,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
               (plVar4 + 0xd));
    bVar5 = Type_Info::bare_equal_type_info
                      (&(lhs_1.m_data.
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(type_info *)&bool::typeinfo);
    if ((bVar5) &&
       (bVar5 = Type_Info::bare_equal_type_info
                          (&(rhs.m_data.
                             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_type_info,(type_info *)&bool::typeinfo), bVar5)) {
      std::operator+(&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (**(long **)(*in_RDX + 0x50) + 0x10)," ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     &local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*in_RDX + 0x10));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val," ");
      std::operator+(&match,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (*(long *)(*(long *)(*in_RDX + 0x50) + 8) + 0x10));
      std::__cxx11::string::~string((string *)&lhs);
      std::__cxx11::string::~string((string *)&val);
      std::__cxx11::string::~string((string *)&local_98);
      val.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr._0_1_ = boxed_cast<bool>(&lhs_1,(Type_Conversions_State *)0x0);
      val.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr._1_1_ = boxed_cast<bool>(&rhs,(Type_Conversions_State *)0x0);
      val.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr._4_4_ = *(undefined4 *)(*in_RDX + 8);
      optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
      anon_class_8_3_e7ab8eae::operator()((anon_class_8_3_e7ab8eae *)&lhs);
      make_unique<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,chaiscript::eval::Constant_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::__cxx11::string_const,chaiscript::Parse_Location&,chaiscript::Boxed_Value_const>
                ((chaiscript *)this,&match,(Parse_Location *)(*in_RDX + 0x30),&lhs);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&lhs.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__cxx11::string::~string((string *)&match);
LAB_003c3dff:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&rhs.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      p_Var7 = &lhs_1.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
      goto LAB_003c3e0e;
    }
LAB_003c3c2d:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&rhs.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    p_Var7 = &lhs_1.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
  }
  else {
    if (iVar1 != 1) {
      if (iVar1 != 0x28) {
        if (((iVar1 != 0x15) || (*(long *)(lVar2 + 0x58) - (long)*(long **)(lVar2 + 0x50) != 8)) ||
           (*(int *)(**(long **)(lVar2 + 0x50) + 8) != 0x2b)) goto LAB_003c3cc8;
        t_str._M_str = (char *)0x1;
        t_str._M_len = *(size_t *)(lVar2 + 0x10);
        OVar6 = Operators::to_operator(*(Operators **)(lVar2 + 0x18),t_str,true);
        std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&lhs,
                   (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                   (**(long **)(*in_RDX + 0x50) + 0x68));
        std::operator+(&match,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (lVar2 + 0x10),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (**(long **)(*in_RDX + 0x50) + 0x10));
        if (((OVar6 == bitwise_and) || (OVar6 == invalid)) ||
           ((((lhs.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->m_type_info).m_flags & 0x10) == 0)) {
          bVar5 = Type_Info::bare_equal_type_info
                            (&(lhs.m_data.
                               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->m_type_info,(type_info *)&bool::typeinfo);
          if ((!bVar5) ||
             (bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)(lVar2 + 0x10),"!"), !bVar5)) {
            std::__cxx11::string::~string((string *)&match);
            p_Var7 = &lhs.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount;
            goto LAB_003c3cc3;
          }
          lVar2 = *in_RDX;
          boxed_cast<bool>(&lhs,(Type_Conversions_State *)0x0);
          Boxed_Value::Object_Data::get<bool>
                    (val.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr._7_1_,
                     val.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr._5_1_);
          make_unique<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,chaiscript::eval::Constant_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::__cxx11::string_const,chaiscript::Parse_Location&,chaiscript::Boxed_Value>
                    ((chaiscript *)this,&match,(Parse_Location *)(lVar2 + 0x30),&val);
        }
        else {
          Boxed_Number::oper((Boxed_Number *)&val,OVar6,&lhs);
          make_unique<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,chaiscript::eval::Constant_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::__cxx11::string_const,chaiscript::Parse_Location&,chaiscript::Boxed_Value_const>
                    ((chaiscript *)this,&match,(Parse_Location *)(*in_RDX + 0x30),&val);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&val.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__cxx11::string::~string((string *)&match);
        p_Var7 = &lhs.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
LAB_003c3e0e:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var7);
        return (__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
                )(__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
                  )this;
      }
      plVar4 = *(long **)(lVar2 + 0x50);
      if ((((*(long *)(lVar2 + 0x58) - (long)plVar4 != 0x10) || (*(int *)(*plVar4 + 8) != 0x2b)) ||
          (*(int *)(plVar4[1] + 8) != 0x2b)) ||
         (t_str_00._M_str = (char *)0x0, t_str_00._M_len = *(ulong *)(lVar2 + 0x10),
         OVar6 = Operators::to_operator(*(Operators **)(lVar2 + 0x18),t_str_00,SUB81(*plVar4,0)),
         OVar6 == invalid)) goto LAB_003c3cc8;
      if (*(undefined ***)**(long **)(*in_RDX + 0x50) != &PTR_get_children_00488068) {
        __cxa_bad_cast();
      }
      std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&lhs_1,
                 (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long *)**(long **)(*in_RDX + 0x50) + 0xd));
      plVar4 = *(long **)(*(long *)(*in_RDX + 0x50) + 8);
      if ((undefined **)*plVar4 != &PTR_get_children_00488068) {
        __cxa_bad_cast();
      }
      std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&rhs,
                 (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                 (plVar4 + 0xd));
      if (((((lhs_1.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->m_type_info).m_flags & 0x10) != 0) &&
         ((((rhs.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           m_type_info).m_flags & 0x10) != 0)) {
        Boxed_Number::oper((Boxed_Number *)&val_2,OVar6,&lhs_1,&rhs);
        std::operator+(&local_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (**(long **)(*in_RDX + 0x50) + 0x10)," ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                       &local_98,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (lVar2 + 0x10));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val," "
                      );
        std::operator+(&match,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)(*(long *)(*in_RDX + 0x50) + 8) + 0x10));
        std::__cxx11::string::~string((string *)&lhs);
        std::__cxx11::string::~string((string *)&val);
        std::__cxx11::string::~string((string *)&local_98);
        make_unique<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,chaiscript::eval::Constant_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::__cxx11::string_const,chaiscript::Parse_Location&,chaiscript::Boxed_Value_const>
                  ((chaiscript *)this,&match,(Parse_Location *)(*in_RDX + 0x30),&val_2);
        std::__cxx11::string::~string((string *)&match);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&val_2.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        goto LAB_003c3dff;
      }
      goto LAB_003c3c2d;
    }
    plVar4 = *(long **)(lVar2 + 0x50);
    if (((*(long *)(lVar2 + 0x58) - (long)plVar4 != 0x10) || (*(int *)(*plVar4 + 8) != 0)) ||
       ((lVar2 = plVar4[1], *(int *)(lVar2 + 8) != 3 ||
        ((*(long *)(lVar2 + 0x58) - (long)*(long **)(lVar2 + 0x50) != 8 ||
         (plVar4 = (long *)**(long **)(lVar2 + 0x50), (int)plVar4[1] != 0x2b))))))
    goto LAB_003c3cc8;
    if ((undefined **)*plVar4 != &PTR_get_children_00488068) {
      __cxa_bad_cast();
    }
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&match,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
               (plVar4 + 0xd));
    if ((match._M_dataplus._M_p[0x10] & 0x10U) != 0) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (**(long **)(*in_RDX + 0x50) + 0x10);
      lhs.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__lhs;
      bVar5 = std::operator==(__lhs,"double");
      if (bVar5) {
        std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_38,
                   (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)&match
                  );
        Boxed_Number::Boxed_Number((Boxed_Number *)&val,(Boxed_Value *)&local_38);
        val_01 = Boxed_Number::get_as<double>((Boxed_Number *)&val);
        optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>(std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>)
        ::{lambda(auto:1)#1}::operator()((_lambda_auto_1__1_ *)this,val_01);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&val.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        p_Var7 = &local_38._M_refcount;
      }
      else {
        bVar5 = std::operator==(__lhs,"int");
        if (bVar5) {
          std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_48,
                     (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                     &match);
          Boxed_Number::Boxed_Number((Boxed_Number *)&val,(Boxed_Value *)&local_48);
          Boxed_Number::get_as<int>((Boxed_Number *)&val);
          optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>(std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>)
          ::{lambda(auto:1)#1}::operator()((_lambda_auto_1__1_ *)this,(int)&lhs);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&val.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          p_Var7 = &local_48._M_refcount;
        }
        else {
          bVar5 = std::operator==(__lhs,"float");
          if (bVar5) {
            std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr(&local_58,
                         (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                         &match);
            Boxed_Number::Boxed_Number((Boxed_Number *)&val,(Boxed_Value *)&local_58);
            val_00 = Boxed_Number::get_as<float>((Boxed_Number *)&val);
            optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>(std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>)
            ::{lambda(auto:1)#1}::operator()((_lambda_auto_1__1_ *)this,val_00);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&val.m_data.
                        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
            p_Var7 = &local_58._M_refcount;
          }
          else {
            bVar5 = std::operator==(__lhs,"long");
            if (bVar5) {
              std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr(&local_68,
                           (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                            *)&match);
              Boxed_Number::Boxed_Number((Boxed_Number *)&val,(Boxed_Value *)&local_68);
              Boxed_Number::get_as<long>((Boxed_Number *)&val);
              optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>(std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>)
              ::{lambda(auto:1)#1}::operator()((_lambda_auto_1__1_ *)this,(long)&lhs);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&val.m_data.
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              p_Var7 = &local_68._M_refcount;
            }
            else {
              bVar5 = std::operator==(__lhs,"size_t");
              if (!bVar5) goto LAB_003c3cad;
              std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr(&local_78,
                           (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                            *)&match);
              Boxed_Number::Boxed_Number((Boxed_Number *)&val,(Boxed_Value *)&local_78);
              Boxed_Number::get_as<unsigned_long>((Boxed_Number *)&val);
              optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>(std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>,std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>>)
              ::{lambda(auto:1)#1}::operator()((_lambda_auto_1__1_ *)this,(unsigned_long)&lhs);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&val.m_data.
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              p_Var7 = &local_78._M_refcount;
            }
          }
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var7);
      p_Var7 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&match._M_string_length;
      goto LAB_003c3e0e;
    }
LAB_003c3cad:
    p_Var7 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&match._M_string_length;
  }
LAB_003c3cc3:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var7);
LAB_003c3cc8:
  *(long *)this = *in_RDX;
  *in_RDX = 0;
  return (__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
          )(__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
            )this;
}

Assistant:

auto optimize(eval::AST_Node_Impl_Ptr<T> node) {
        if (node->identifier == AST_Node_Type::Prefix && node->children.size() == 1 && node->children[0]->identifier == AST_Node_Type::Constant) {
          try {
            const auto &oper = node->text;
            const auto parsed = Operators::to_operator(oper, true);
            const auto lhs = dynamic_cast<const eval::Constant_AST_Node<T> *>(node->children[0].get())->m_value;
            const auto match = oper + node->children[0]->text;

            if (parsed != Operators::Opers::invalid && parsed != Operators::Opers::bitwise_and && lhs.get_type_info().is_arithmetic()) {
              const auto val = Boxed_Number::do_oper(parsed, lhs);
              return chaiscript::make_unique<eval::AST_Node_Impl<T>, eval::Constant_AST_Node<T>>(std::move(match),
                                                                                                 node->location,
                                                                                                 std::move(val));
            } else if (lhs.get_type_info().bare_equal_type_info(typeid(bool)) && oper == "!") {
              return chaiscript::make_unique<eval::AST_Node_Impl<T>, eval::Constant_AST_Node<T>>(std::move(match),
                                                                                                 node->location,
                                                                                                 Boxed_Value(!boxed_cast<bool>(lhs)));
            }
          } catch (const std::exception &) {
            // failure to fold, that's OK
          }
        } else if ((node->identifier == AST_Node_Type::Logical_And || node->identifier == AST_Node_Type::Logical_Or)
                   && node->children.size() == 2 && node->children[0]->identifier == AST_Node_Type::Constant
                   && node->children[1]->identifier == AST_Node_Type::Constant) {
          try {
            const auto lhs = dynamic_cast<const eval::Constant_AST_Node<T> &>(*node->children[0]).m_value;
            const auto rhs = dynamic_cast<const eval::Constant_AST_Node<T> &>(*node->children[1]).m_value;
            if (lhs.get_type_info().bare_equal_type_info(typeid(bool)) && rhs.get_type_info().bare_equal_type_info(typeid(bool))) {
              const auto match = node->children[0]->text + " " + node->text + " " + node->children[1]->text;
              const auto val = [lhs_val = boxed_cast<bool>(lhs), rhs_val = boxed_cast<bool>(rhs), id = node->identifier] {
                if (id == AST_Node_Type::Logical_And) {
                  return Boxed_Value(lhs_val && rhs_val);
                } else {
                  return Boxed_Value(lhs_val || rhs_val);
                }
              }();

              return chaiscript::make_unique<eval::AST_Node_Impl<T>, eval::Constant_AST_Node<T>>(std::move(match),
                                                                                                 node->location,
                                                                                                 std::move(val));
            }
          } catch (const std::exception &) {
            // failure to fold, that's OK
          }
        } else if (node->identifier == AST_Node_Type::Binary && node->children.size() == 2
                   && node->children[0]->identifier == AST_Node_Type::Constant && node->children[1]->identifier == AST_Node_Type::Constant) {
          try {
            const auto &oper = node->text;
            const auto parsed = Operators::to_operator(oper);
            if (parsed != Operators::Opers::invalid) {
              const auto lhs = dynamic_cast<const eval::Constant_AST_Node<T> &>(*node->children[0]).m_value;
              const auto rhs = dynamic_cast<const eval::Constant_AST_Node<T> &>(*node->children[1]).m_value;
              if (lhs.get_type_info().is_arithmetic() && rhs.get_type_info().is_arithmetic()) {
                const auto val = Boxed_Number::do_oper(parsed, lhs, rhs);
                const auto match = node->children[0]->text + " " + oper + " " + node->children[1]->text;
                return chaiscript::make_unique<eval::AST_Node_Impl<T>, eval::Constant_AST_Node<T>>(std::move(match),
                                                                                                   node->location,
                                                                                                   std::move(val));
              }
            }
          } catch (const std::exception &) {
            // failure to fold, that's OK
          }
        } else if (node->identifier == AST_Node_Type::Fun_Call && node->children.size() == 2
                   && node->children[0]->identifier == AST_Node_Type::Id && node->children[1]->identifier == AST_Node_Type::Arg_List
                   && node->children[1]->children.size() == 1 && node->children[1]->children[0]->identifier == AST_Node_Type::Constant) {
          const auto arg = dynamic_cast<const eval::Constant_AST_Node<T> &>(*node->children[1]->children[0]).m_value;
          if (arg.get_type_info().is_arithmetic()) {
            const auto &fun_name = node->children[0]->text;

            const auto make_constant = [&node, &fun_name](auto val) {
              const auto match = fun_name + "(" + node->children[1]->children[0]->text + ")";
              return chaiscript::make_unique<eval::AST_Node_Impl<T>, eval::Constant_AST_Node<T>>(std::move(match),
                                                                                                 node->location,
                                                                                                 const_var(val));
            };

            if (fun_name == "double") {
              return make_constant(Boxed_Number(arg).get_as<double>());
            } else if (fun_name == "int") {
              return make_constant(Boxed_Number(arg).get_as<int>());
            } else if (fun_name == "float") {
              return make_constant(Boxed_Number(arg).get_as<float>());
            } else if (fun_name == "long") {
              return make_constant(Boxed_Number(arg).get_as<long>());
            } else if (fun_name == "size_t") {
              return make_constant(Boxed_Number(arg).get_as<size_t>());
            }
          }
        }

        return node;
      }